

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O0

shared_ptr<libtorrent::torrent_plugin>
libtorrent::create_ut_pex_plugin(torrent_handle *th,client_data_t param_2)

{
  bool bVar1;
  element_type *this;
  torrent_info *ptVar2;
  session_settings *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<libtorrent::torrent_plugin> sVar4;
  undefined1 local_50 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  torrent *t;
  torrent_handle *th_local;
  client_data_t param_1_local;
  
  th_local = (torrent_handle *)param_2.m_client_ptr;
  t = (torrent *)param_2.m_type_ptr;
  param_1_local.m_client_ptr = th;
  torrent_handle::native_handle((torrent_handle *)(local_50 + 0x10));
  this = ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                    (local_50 + 0x10));
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)(local_50 + 0x10));
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  ptVar2 = aux::torrent::torrent_file(this);
  bVar1 = torrent_info::priv(ptVar2);
  if (bVar1) {
LAB_007bdd64:
    ::std::shared_ptr<libtorrent::torrent_plugin>::shared_ptr
              ((shared_ptr<libtorrent::torrent_plugin> *)th);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    ptVar2 = aux::torrent::torrent_file((torrent *)local_30._M_pi);
    bVar1 = torrent_info::is_i2p(ptVar2);
    if (bVar1) {
      this_00 = aux::torrent::settings((torrent *)local_30._M_pi);
      bVar1 = aux::session_settings::get_bool(this_00,0x8017);
      if (!bVar1) goto LAB_007bdd64;
    }
    ::std::make_shared<libtorrent::(anonymous_namespace)::ut_pex_plugin,libtorrent::aux::torrent&>
              ((torrent *)local_50);
    ::std::shared_ptr<libtorrent::torrent_plugin>::
    shared_ptr<libtorrent::(anonymous_namespace)::ut_pex_plugin,void>
              ((shared_ptr<libtorrent::torrent_plugin> *)th,
               (shared_ptr<libtorrent::(anonymous_namespace)::ut_pex_plugin> *)local_50);
    ::std::shared_ptr<libtorrent::(anonymous_namespace)::ut_pex_plugin>::~shared_ptr
              ((shared_ptr<libtorrent::(anonymous_namespace)::ut_pex_plugin> *)local_50);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  sVar4.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)th;
  return (shared_ptr<libtorrent::torrent_plugin>)
         sVar4.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent_plugin> create_ut_pex_plugin(torrent_handle const& th, client_data_t)
	{
		aux::torrent* t = th.native_handle().get();
		if (t->torrent_file().priv() || (t->torrent_file().is_i2p()
			&& !t->settings().get_bool(settings_pack::allow_i2p_mixed)))
		{
			return {};
		}
		return std::make_shared<ut_pex_plugin>(*t);
	}